

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-io.c
# Opt level: O1

_Bool get_tempfile(GError **error)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FILE *pFVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Bool _Var9;
  
  tmpfile_path = (char *)g_strdup("rifiuti-XXXXXX");
  iVar2 = g_mkstemp(tmpfile_path);
  if (iVar2 == -1) {
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    uVar3 = g_file_error_quark();
    uVar4 = g_file_error_from_errno(iVar2);
    _Var9 = false;
    uVar7 = dcgettext(0,"Can not create temp file: %s",5);
    uVar8 = g_strerror(iVar2);
    g_set_error(error,uVar3,uVar4,uVar7,uVar8);
  }
  else {
    pFVar5 = fdopen(iVar2,"wb");
    if (pFVar5 == (FILE *)0x0) {
      piVar6 = __errno_location();
      iVar1 = *piVar6;
      uVar3 = g_file_error_quark();
      uVar4 = g_file_error_from_errno(iVar1);
      _Var9 = false;
      uVar7 = dcgettext(0,"Can not open temp file: %s",5);
      uVar8 = g_strerror(iVar1);
      g_set_error(error,uVar3,uVar4,uVar7,uVar8);
      g_close(iVar2,0);
    }
    else {
      prev_fh = out_fh;
      _Var9 = true;
      out_fh = (FILE *)pFVar5;
    }
  }
  return _Var9;
}

Assistant:

bool
get_tempfile    (GError   **error)
{
    int     fd, e = 0;
    FILE   *tmp_fh;

    // segfaults if string is pre-allocated in stack
    tmpfile_path = g_strdup ("rifiuti-XXXXXX");

    if (-1 == (fd = g_mkstemp(tmpfile_path))) {
        e = errno;
        g_set_error (error, G_FILE_ERROR, g_file_error_from_errno(e),
            _("Can not create temp file: %s"), g_strerror(e));
        return false;
    }

    if (NULL == (tmp_fh = fdopen (fd, "wb"))) {
        e = errno;
        g_set_error (error, G_FILE_ERROR, g_file_error_from_errno(e),
            _("Can not open temp file: %s"), g_strerror(e));
        g_close (fd, NULL);
        return false;
    }

    prev_fh = out_fh;
    out_fh  = tmp_fh;

    return true;
}